

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

bool __thiscall jrtplib::RTPTCPTransmitter::NewDataAvailable(RTPTCPTransmitter *this)

{
  if ((this->m_init == true) && (this->m_created == true)) {
    return (this->m_rawpacketlist).
           super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
           _M_impl._M_node.super__List_node_base._M_next !=
           (_List_node_base *)&this->m_rawpacketlist;
  }
  return false;
}

Assistant:

bool RTPTCPTransmitter::NewDataAvailable()
{
	if (!m_init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!m_created)
		v = false;
	else
	{
		if (m_rawpacketlist.empty())
			v = false;
		else
			v = true;
	}
	
	MAINMUTEX_UNLOCK
	return v;
}